

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  char cVar1;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  float v_15;
  int i_15;
  float bias_5;
  float scale_out_5;
  float scale_in_5;
  char *ptr_4;
  int *intptr_4;
  int q_1;
  float v_14;
  int i_14;
  float scale_out_4;
  float scale_in_4;
  char *ptr_3;
  int *intptr_3;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  float v_13;
  int j_1;
  float bias_4;
  float scale_out_3;
  float scale_in_3;
  char *ptr_2;
  int *intptr_2;
  int i_13;
  float v_12;
  int j;
  float scale_out_2;
  float scale_in_2;
  char *ptr_1;
  int *intptr_1;
  int i_12;
  int h;
  int w_1;
  float v_11;
  int i_11;
  float v_10;
  int i_10;
  float bias_3;
  float v_9;
  int i_9;
  float v_8;
  int i_8;
  float v_7;
  int i_7;
  float bias_2;
  float v_6;
  int i_6;
  float scale_out_1;
  float v_5;
  int i_5;
  float v_4;
  int i_4;
  float bias_1;
  float v_3;
  int i_3;
  float scale_in_1;
  float v_2;
  int i_2;
  float v_1;
  int i_1;
  float bias;
  float v;
  int i;
  float scale_out;
  float scale_in;
  char *ptr;
  int *intptr;
  int w;
  int dims;
  Mat *m_2;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f8;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffff5fc;
  undefined4 uVar4;
  Allocator *in_stack_fffffffffffff600;
  undefined8 *puVar5;
  size_t in_stack_fffffffffffff608;
  Mat *in_stack_fffffffffffff610;
  undefined8 in_stack_fffffffffffff618;
  Mat *in_stack_fffffffffffff620;
  undefined4 local_9b0;
  float local_9ac;
  float local_94c;
  undefined4 local_948;
  float local_944;
  undefined4 local_940;
  float local_93c;
  int local_908;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined8 local_8e8;
  undefined4 local_8e0;
  long local_8d8;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined8 local_8b8;
  long local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined4 local_890;
  long local_888;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined8 local_868;
  long local_860;
  int local_854;
  float local_850;
  int local_84c;
  undefined4 local_848;
  float local_844;
  undefined8 local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined4 local_828;
  long local_820;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined8 local_800;
  long local_7f8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined4 local_7c8;
  long local_7c0;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined8 local_7a0;
  long local_798;
  int local_790;
  int local_78c;
  int local_788;
  int local_784;
  int local_780;
  float local_77c;
  int local_778;
  float local_774;
  undefined4 local_770;
  float local_76c;
  long local_768;
  long local_760;
  int local_754;
  float local_750;
  int local_74c;
  undefined4 local_748;
  float local_744;
  long local_740;
  long local_738;
  int local_72c;
  int local_728;
  int local_724;
  float local_720;
  int local_71c;
  float local_718;
  int local_714;
  float local_710;
  float local_70c;
  int local_708;
  float local_704;
  int local_700;
  float local_6fc;
  int local_6f8;
  float local_6f4;
  float local_6f0;
  int local_6ec;
  undefined4 local_6e8;
  float local_6e4;
  int local_6e0;
  float local_6dc;
  int local_6d8;
  float local_6d4;
  float local_6d0;
  int local_6cc;
  float local_6c8;
  float local_6c4;
  int local_6c0;
  float local_6bc;
  int local_6b8;
  float local_6b4;
  float local_6b0;
  int local_6ac;
  undefined4 local_6a8;
  float local_6a4;
  long local_6a0;
  long local_698;
  int local_690;
  int local_68c;
  long *local_680;
  long *local_678;
  undefined8 *local_660;
  undefined8 *local_650;
  undefined8 *local_640;
  undefined8 *local_630;
  long *local_620;
  long *local_618;
  long *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  long *local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  long *local_5e0;
  long local_5d8;
  long local_5d0;
  undefined8 local_5c8;
  long local_5c0;
  long local_5b8;
  long *local_5b0;
  undefined8 local_5a8;
  undefined8 *local_5a0;
  long local_598;
  long *local_590;
  undefined8 local_588;
  undefined8 *local_580;
  long local_578;
  long *local_570;
  undefined8 local_568;
  undefined8 *local_560;
  long local_558;
  long *local_550;
  undefined8 local_548;
  undefined8 *local_540;
  long local_538;
  long *local_530;
  undefined8 local_528;
  undefined8 *local_520;
  long local_518;
  long *local_510;
  undefined8 local_508;
  undefined8 *local_500;
  long local_4f8;
  long *local_4f0;
  undefined8 local_4e8;
  undefined8 *local_4e0;
  long local_4d8;
  long *local_4d0;
  undefined8 local_4c8;
  undefined8 *local_4c0;
  long local_4b8;
  long *local_4b0;
  undefined8 local_4a8;
  undefined8 *local_4a0;
  long local_498;
  long local_490;
  long local_488;
  long *local_480;
  long local_478;
  long *local_470;
  long local_468;
  long local_460;
  long local_458;
  long *local_450;
  undefined8 local_448;
  undefined8 *local_440;
  long local_438;
  long local_430;
  long local_428;
  long *local_420;
  long local_418;
  long *local_410;
  long local_408;
  long *local_400;
  long local_3f8;
  long *local_3f0;
  undefined8 local_3e8;
  undefined8 *local_3e0;
  long local_3d8;
  long *local_3d0;
  undefined8 local_3c8;
  undefined8 *local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long *local_3a0;
  long local_398;
  long local_390;
  undefined8 local_388;
  undefined8 *local_380;
  long local_378;
  long local_370;
  undefined8 local_368;
  undefined8 *local_360;
  long local_358;
  long *local_350;
  undefined8 local_348;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 *local_320;
  int local_314;
  long *local_310;
  int local_304;
  long *local_300;
  int local_2f4;
  long *local_2f0;
  int local_2e4;
  long *local_2e0;
  undefined1 local_2d5;
  int local_2d4;
  undefined8 *local_2c8;
  undefined1 local_2b5;
  int local_2b4;
  undefined8 *local_2a8;
  undefined1 local_295;
  int local_294;
  undefined8 *local_288;
  undefined1 local_275;
  int local_274;
  undefined8 *local_268;
  undefined8 *local_200;
  undefined8 *local_1e0;
  undefined8 *local_1c0;
  undefined8 *local_1a0;
  long *local_138;
  long *local_130;
  long *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  long local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  long local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  long local_78;
  undefined4 local_6c;
  long local_68;
  long local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_68c = (int)in_RSI[5];
  local_680 = in_RDX;
  local_678 = in_RSI;
  if (local_68c == 1) {
    local_690 = *(int *)((long)in_RSI + 0x2c);
    Mat::create(in_stack_fffffffffffff610,(int)(in_stack_fffffffffffff608 >> 0x20),
                (size_t)in_stack_fffffffffffff600,
                (Allocator *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    local_610 = local_680;
    bVar2 = true;
    if (*local_680 != 0) {
      local_138 = local_680;
      bVar2 = local_680[8] * (long)(int)local_680[7] == 0;
    }
    if (bVar2) {
      return -100;
    }
    local_5f8 = local_678;
    local_698 = *local_678;
    local_5e0 = local_680;
    local_6a0 = *local_680;
    if ((*(int *)(in_RDI + 0xd0) == 1) && (*(int *)(in_RDI + 0xd4) == 1)) {
      local_320 = (undefined8 *)(in_RDI + 0x128);
      local_328 = 0;
      local_6a4 = *(float *)*local_320;
      local_330 = (undefined8 *)(in_RDI + 0x170);
      local_338 = 0;
      local_6a8 = *(undefined4 *)*local_330;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_6ac = 0; local_6ac < local_690; local_6ac = local_6ac + 1) {
          local_6b0 = (float)*(int *)(local_698 + (long)local_6ac * 4) * local_6a4;
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_6ac) = cVar1;
        }
      }
      else if (*(int *)(in_RDI + 0xd8) == 1) {
        local_340 = (undefined8 *)(in_RDI + 0x1b8);
        local_348 = 0;
        local_6b4 = *(float *)*local_340;
        for (local_6b8 = 0; local_6b8 < local_690; local_6b8 = local_6b8 + 1) {
          local_6bc = (float)*(int *)(local_698 + (long)local_6b8 * 4) * local_6a4 + local_6b4;
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_6b8) = cVar1;
        }
      }
      else {
        for (local_6c0 = 0; local_6c0 < local_690; local_6c0 = local_6c0 + 1) {
          local_350 = (long *)(in_RDI + 0x1b8);
          local_358 = (long)local_6c0;
          local_6c4 = (float)*(int *)(local_698 + (long)local_6c0 * 4) * local_6a4 +
                      *(float *)(*local_350 + local_358 * 4);
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_6c0) = cVar1;
        }
      }
    }
    else if ((*(int *)(in_RDI + 0xd0) == 1) && (1 < *(int *)(in_RDI + 0xd4))) {
      local_360 = (undefined8 *)(in_RDI + 0x128);
      local_368 = 0;
      local_6c8 = *(float *)*local_360;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_6cc = 0; local_6cc < local_690; local_6cc = local_6cc + 1) {
          local_6d0 = (float)*(int *)(local_698 + (long)local_6cc * 4) * local_6c8;
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          local_370 = in_RDI + 0x170;
          local_378 = (long)local_6cc;
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_6cc) = cVar1;
        }
      }
      else if (*(int *)(in_RDI + 0xd8) == 1) {
        local_380 = (undefined8 *)(in_RDI + 0x1b8);
        local_388 = 0;
        local_6d4 = *(float *)*local_380;
        for (local_6d8 = 0; local_6d8 < local_690; local_6d8 = local_6d8 + 1) {
          local_6dc = (float)*(int *)(local_698 + (long)local_6d8 * 4) * local_6c8 + local_6d4;
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          local_390 = in_RDI + 0x170;
          local_398 = (long)local_6d8;
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_6d8) = cVar1;
        }
      }
      else {
        for (local_6e0 = 0; local_6e0 < local_690; local_6e0 = local_6e0 + 1) {
          local_3a0 = (long *)(in_RDI + 0x1b8);
          local_3a8 = (long)local_6e0;
          local_6e4 = (float)*(int *)(local_698 + (long)local_6e0 * 4) * local_6c8 +
                      *(float *)(*local_3a0 + local_3a8 * 4);
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          local_3b0 = in_RDI + 0x170;
          local_3b8 = (long)local_6e0;
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_6e0) = cVar1;
        }
      }
    }
    else if ((*(int *)(in_RDI + 0xd0) < 2) || (*(int *)(in_RDI + 0xd4) != 1)) {
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_708 = 0; local_708 < local_690; local_708 = local_708 + 1) {
          local_420 = (long *)(in_RDI + 0x128);
          local_428 = (long)local_708;
          local_70c = (float)*(int *)(local_698 + (long)local_708 * 4) *
                      *(float *)(*local_420 + local_428 * 4);
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          local_430 = in_RDI + 0x170;
          local_438 = (long)local_708;
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_708) = cVar1;
        }
      }
      else if (*(int *)(in_RDI + 0xd8) == 1) {
        local_440 = (undefined8 *)(in_RDI + 0x1b8);
        local_448 = 0;
        local_710 = *(float *)*local_440;
        for (local_714 = 0; local_714 < local_690; local_714 = local_714 + 1) {
          local_450 = (long *)(in_RDI + 0x128);
          local_458 = (long)local_714;
          local_718 = (float)*(int *)(local_698 + (long)local_714 * 4) *
                      *(float *)(*local_450 + local_458 * 4) + local_710;
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          local_460 = in_RDI + 0x170;
          local_468 = (long)local_714;
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_714) = cVar1;
        }
      }
      else {
        for (local_71c = 0; local_71c < local_690; local_71c = local_71c + 1) {
          local_470 = (long *)(in_RDI + 0x128);
          local_478 = (long)local_71c;
          local_480 = (long *)(in_RDI + 0x1b8);
          local_488 = (long)local_71c;
          local_720 = (float)*(int *)(local_698 + (long)local_71c * 4) *
                      *(float *)(*local_470 + local_478 * 4) +
                      *(float *)(*local_480 + local_488 * 4);
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          local_490 = in_RDI + 0x170;
          local_498 = (long)local_71c;
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_71c) = cVar1;
        }
      }
    }
    else {
      local_3c0 = (undefined8 *)(in_RDI + 0x170);
      local_3c8 = 0;
      local_6e8 = *(undefined4 *)*local_3c0;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_6ec = 0; local_6ec < local_690; local_6ec = local_6ec + 1) {
          local_3d0 = (long *)(in_RDI + 0x128);
          local_3d8 = (long)local_6ec;
          local_6f0 = (float)*(int *)(local_698 + (long)local_6ec * 4) *
                      *(float *)(*local_3d0 + local_3d8 * 4);
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_6ec) = cVar1;
        }
      }
      else if (*(int *)(in_RDI + 0xd8) == 1) {
        local_3e0 = (undefined8 *)(in_RDI + 0x1b8);
        local_3e8 = 0;
        local_6f4 = *(float *)*local_3e0;
        for (local_6f8 = 0; local_6f8 < local_690; local_6f8 = local_6f8 + 1) {
          local_3f0 = (long *)(in_RDI + 0x128);
          local_3f8 = (long)local_6f8;
          local_6fc = (float)*(int *)(local_698 + (long)local_6f8 * 4) *
                      *(float *)(*local_3f0 + local_3f8 * 4) + local_6f4;
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_6f8) = cVar1;
        }
      }
      else {
        for (local_700 = 0; local_700 < local_690; local_700 = local_700 + 1) {
          local_400 = (long *)(in_RDI + 0x128);
          local_408 = (long)local_700;
          local_410 = (long *)(in_RDI + 0x1b8);
          local_418 = (long)local_700;
          local_704 = (float)*(int *)(local_698 + (long)local_700 * 4) *
                      *(float *)(*local_400 + local_408 * 4) +
                      *(float *)(*local_410 + local_418 * 4);
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_6a0 + local_700) = cVar1;
        }
      }
    }
  }
  if (local_68c == 2) {
    local_724 = *(int *)((long)local_678 + 0x2c);
    local_728 = (int)local_678[6];
    Mat::create(in_stack_fffffffffffff610,(int)(in_stack_fffffffffffff608 >> 0x20),
                (int)in_stack_fffffffffffff608,(size_t)in_stack_fffffffffffff600,
                (Allocator *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    local_618 = local_680;
    bVar2 = true;
    if (*local_680 != 0) {
      local_130 = local_680;
      bVar2 = local_680[8] * (long)(int)local_680[7] == 0;
    }
    if (bVar2) {
      return -100;
    }
    if (*(int *)(in_RDI + 0xd8) == 0) {
      for (local_72c = 0; local_72c < local_728; local_72c = local_72c + 1) {
        local_300 = local_678;
        local_304 = local_72c;
        local_738 = *local_678 +
                    (long)*(int *)((long)local_678 + 0x2c) * (long)local_72c * local_678[2];
        local_2e0 = local_680;
        local_2e4 = local_72c;
        local_740 = *local_680 +
                    (long)*(int *)((long)local_680 + 0x2c) * (long)local_72c * local_680[2];
        if (*(int *)(in_RDI + 0xd0) == 1) {
          local_4a0 = (undefined8 *)(in_RDI + 0x128);
          local_4a8 = 0;
          local_93c = *(float *)*local_4a0;
        }
        else {
          local_4b0 = (long *)(in_RDI + 0x128);
          local_4b8 = (long)local_72c;
          local_93c = *(float *)(*local_4b0 + local_4b8 * 4);
        }
        local_744 = local_93c;
        if (*(int *)(in_RDI + 0xd4) == 1) {
          local_4c0 = (undefined8 *)(in_RDI + 0x170);
          local_4c8 = 0;
          local_940 = *(undefined4 *)*local_4c0;
        }
        else {
          local_4d0 = (long *)(in_RDI + 0x170);
          local_4d8 = (long)local_72c;
          local_940 = *(undefined4 *)(*local_4d0 + local_4d8 * 4);
        }
        local_748 = local_940;
        for (local_74c = 0; local_74c < local_724; local_74c = local_74c + 1) {
          local_750 = (float)*(int *)(local_738 + (long)local_74c * 4) * local_744;
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_740 + local_74c) = cVar1;
        }
      }
    }
    else {
      for (local_754 = 0; local_754 < local_728; local_754 = local_754 + 1) {
        local_310 = local_678;
        local_314 = local_754;
        local_760 = *local_678 +
                    (long)*(int *)((long)local_678 + 0x2c) * (long)local_754 * local_678[2];
        local_2f0 = local_680;
        local_2f4 = local_754;
        local_768 = *local_680 +
                    (long)*(int *)((long)local_680 + 0x2c) * (long)local_754 * local_680[2];
        if (*(int *)(in_RDI + 0xd0) == 1) {
          local_4e0 = (undefined8 *)(in_RDI + 0x128);
          local_4e8 = 0;
          local_944 = *(float *)*local_4e0;
        }
        else {
          local_4f0 = (long *)(in_RDI + 0x128);
          local_4f8 = (long)local_754;
          local_944 = *(float *)(*local_4f0 + local_4f8 * 4);
        }
        local_76c = local_944;
        if (*(int *)(in_RDI + 0xd4) == 1) {
          local_500 = (undefined8 *)(in_RDI + 0x170);
          local_508 = 0;
          local_948 = *(undefined4 *)*local_500;
        }
        else {
          local_510 = (long *)(in_RDI + 0x170);
          local_518 = (long)local_754;
          local_948 = *(undefined4 *)(*local_510 + local_518 * 4);
        }
        local_770 = local_948;
        if (*(int *)(in_RDI + 0xd8) == 1) {
          local_520 = (undefined8 *)(in_RDI + 0x1b8);
          local_528 = 0;
          local_94c = *(float *)*local_520;
        }
        else {
          local_530 = (long *)(in_RDI + 0x1b8);
          local_538 = (long)local_754;
          local_94c = *(float *)(*local_530 + local_538 * 4);
        }
        local_774 = local_94c;
        for (local_778 = 0; local_778 < local_724; local_778 = local_778 + 1) {
          local_77c = (float)*(int *)(local_760 + (long)local_778 * 4) * local_76c + local_774;
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_768 + local_778) = cVar1;
        }
      }
    }
  }
  if (local_68c == 3) {
    local_780 = *(int *)((long)local_678 + 0x2c);
    local_784 = (int)local_678[6];
    local_788 = (int)local_678[7];
    local_78c = local_780 * local_784;
    Mat::create(in_stack_fffffffffffff620,(int)((ulong)in_stack_fffffffffffff618 >> 0x20),
                (int)in_stack_fffffffffffff618,(int)((ulong)in_stack_fffffffffffff610 >> 0x20),
                in_stack_fffffffffffff608,in_stack_fffffffffffff600);
    local_620 = local_680;
    bVar2 = true;
    if (*local_680 != 0) {
      local_128 = local_680;
      bVar2 = local_680[8] * (long)(int)local_680[7] == 0;
    }
    if (bVar2) {
      return -100;
    }
    if (*(int *)(in_RDI + 0xd8) == 0) {
      for (local_790 = 0; local_790 < local_788; local_790 = local_790 + 1) {
        local_2a8 = &local_7e0;
        local_84 = *(int *)((long)local_678 + 0x2c);
        local_88 = (int)local_678[6];
        local_8c = *(undefined4 *)((long)local_678 + 0x34);
        local_798 = *local_678 + local_678[8] * (long)local_790 * local_678[2];
        local_a0 = local_678[2];
        local_a4 = (undefined4)local_678[3];
        local_b0 = local_678[4];
        local_80 = &local_7e0;
        local_28 = (long)local_84 * (long)local_88 * local_a0;
        local_600 = &local_7e0;
        local_660 = &local_7e0;
        local_268 = &local_840;
        local_f4 = *(int *)((long)local_680 + 0x2c);
        local_f8 = (int)local_680[6];
        local_fc = *(undefined4 *)((long)local_680 + 0x34);
        local_7f8 = *local_680 + local_680[8] * (long)local_790 * local_680[2];
        local_110 = local_680[2];
        local_114 = (undefined4)local_680[3];
        local_120 = local_680[4];
        local_f0 = &local_840;
        local_8 = (long)local_f4 * (long)local_f8 * local_110;
        local_5e8 = &local_840;
        local_650 = &local_840;
        local_7a8 = 0;
        local_7ac = 0;
        local_7b0 = 0;
        local_7b4 = 0;
        local_7c8 = 0;
        local_7d0 = 0;
        local_7d8 = 0;
        local_7e0 = 0;
        local_c = 0x10;
        local_2c = 0x10;
        local_274 = local_790;
        local_275 = 1;
        local_2b4 = local_790;
        local_2b5 = 1;
        local_7a0 = 0;
        local_7b8 = 0;
        local_840 = 0;
        local_830 = 0;
        local_828 = 0;
        local_818 = 0;
        local_814 = 0;
        local_810 = 0;
        local_80c = 0;
        local_808 = 0;
        local_800 = 0;
        local_838 = 0;
        if (*(int *)(in_RDI + 0xd0) == 1) {
          local_540 = (undefined8 *)(in_RDI + 0x128);
          local_548 = 0;
          local_9ac = *(float *)*local_540;
        }
        else {
          local_550 = (long *)(in_RDI + 0x128);
          local_558 = (long)local_790;
          local_9ac = *(float *)(*local_550 + local_558 * 4);
        }
        local_844 = local_9ac;
        if (*(int *)(in_RDI + 0xd4) == 1) {
          local_560 = (undefined8 *)(in_RDI + 0x170);
          local_568 = 0;
          local_9b0 = *(undefined4 *)*local_560;
        }
        else {
          local_570 = (long *)(in_RDI + 0x170);
          local_578 = (long)local_790;
          local_9b0 = *(undefined4 *)(*local_570 + local_578 * 4);
        }
        local_848 = local_9b0;
        local_1c0 = local_650;
        local_1a0 = local_660;
        local_108 = local_7f8;
        local_98 = local_798;
        local_820 = local_120;
        local_7c0 = local_b0;
        for (local_84c = 0; local_84c < local_78c; local_84c = local_84c + 1) {
          local_850 = (float)*(int *)(local_798 + (long)local_84c * 4) * local_844;
          activation_ss((float)((ulong)in_stack_fffffffffffff600 >> 0x20),
                        (int)in_stack_fffffffffffff600,
                        (Mat *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_7f8 + local_84c) = cVar1;
        }
      }
    }
    else {
      for (local_854 = 0; local_854 < local_788; local_854 = local_854 + 1) {
        local_2c8 = &local_8a8;
        local_4c = *(int *)((long)local_678 + 0x2c);
        local_50 = (int)local_678[6];
        local_54 = *(undefined4 *)((long)local_678 + 0x34);
        local_860 = *local_678 + local_678[8] * (long)local_854 * local_678[2];
        local_68 = local_678[2];
        local_6c = (undefined4)local_678[3];
        local_78 = local_678[4];
        local_48 = &local_8a8;
        local_38 = (long)local_4c * (long)local_50 * local_68;
        local_608 = &local_8a8;
        local_640 = &local_8a8;
        local_288 = &local_8f8;
        local_bc = *(int *)((long)local_680 + 0x2c);
        local_c0 = (int)local_680[6];
        local_c4 = *(undefined4 *)((long)local_680 + 0x34);
        local_8b0 = *local_680 + local_680[8] * (long)local_854 * local_680[2];
        local_d8 = local_680[2];
        local_dc = (undefined4)local_680[3];
        local_e8 = local_680[4];
        local_b8 = &local_8f8;
        local_18 = (long)local_bc * (long)local_c0 * local_d8;
        local_5f0 = &local_8f8;
        puVar5 = &local_8f8;
        local_870 = 0;
        local_874 = 0;
        local_878 = 0;
        local_87c = 0;
        local_890 = 0;
        local_898 = 0;
        local_8a0 = 0;
        local_8a8 = 0;
        local_1c = 0x10;
        local_3c = 0x10;
        local_294 = local_854;
        local_295 = 1;
        local_2d4 = local_854;
        local_2d5 = 1;
        local_868 = 0;
        local_880 = 0;
        local_8f8 = 0;
        local_8e8 = 0;
        local_8e0 = 0;
        local_8d0 = 0;
        local_8cc = 0;
        local_8c8 = 0;
        local_8c4 = 0;
        local_8c0 = 0;
        local_8b8 = 0;
        local_8f0 = 0;
        if (*(int *)(in_RDI + 0xd0) == 1) {
          local_580 = (undefined8 *)(in_RDI + 0x128);
          local_588 = 0;
          uVar4 = *(undefined4 *)*local_580;
        }
        else {
          local_590 = (long *)(in_RDI + 0x128);
          local_598 = (long)local_854;
          uVar4 = *(undefined4 *)(*local_590 + local_598 * 4);
        }
        if (*(int *)(in_RDI + 0xd4) == 1) {
          local_5a0 = (undefined8 *)(in_RDI + 0x170);
          local_5a8 = 0;
          uVar3 = *(undefined4 *)*local_5a0;
        }
        else {
          local_5b0 = (long *)(in_RDI + 0x170);
          local_5b8 = (long)local_854;
          uVar3 = *(undefined4 *)(*local_5b0 + local_5b8 * 4);
        }
        if (*(int *)(in_RDI + 0xd8) == 1) {
          local_5c0 = in_RDI + 0x1b8;
          local_5c8 = 0;
        }
        else {
          local_5d0 = in_RDI + 0x1b8;
          local_5d8 = (long)local_854;
        }
        local_630 = puVar5;
        local_200 = puVar5;
        local_1e0 = local_640;
        local_d0 = local_8b0;
        local_60 = local_860;
        local_8d8 = local_e8;
        local_888 = local_78;
        for (local_908 = 0; local_908 < local_78c; local_908 = local_908 + 1) {
          activation_ss((float)((ulong)puVar5 >> 0x20),(int)puVar5,(Mat *)CONCAT44(uVar4,uVar3));
          cVar1 = float2int8(in_stack_fffffffffffff5f0);
          *(char *)(local_8b0 + local_908) = cVar1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        signed char* ptr = top_blob;

        if (scale_in_data_size == 1 && scale_out_data_size == 1)
        {
            const float scale_in = scale_in_data[0];
            const float scale_out = scale_out_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else if (scale_in_data_size == 1 && scale_out_data_size > 1)
        {
            const float scale_in = scale_in_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
        }
        else if (scale_in_data_size > 1 && scale_out_data_size == 1)
        {
            const float scale_out = scale_out_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else // if (scale_in_data_size > 1 && scale_out_data_size > 1)
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];

                for (int j = 0; j < w; j++)
                {
                    float v = intptr[j] * scale_in;
                    ptr[j] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    float v = intptr[j] * scale_in + bias;
                    ptr[j] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];

                for (int i = 0; i < size; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
    }

    return 0;
}